

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O0

IrrXMLReaderUTF32 * irr::io::createIrrXMLReaderUTF32(FILE *file)

{
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  FILE *file_local;
  
  this = (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  CFileReadCallBack::CFileReadCallBack(this_00,file);
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::CXMLReaderImpl
            (this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReaderUTF32* createIrrXMLReaderUTF32(FILE* file)
{
	return new CXMLReaderImpl<char32, IXMLBase>(new CFileReadCallBack(file)); 
}